

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_socket.cpp
# Opt level: O3

void __thiscall cppnet::ConnectSocket::OnAccept(ConnectSocket *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar3;
  element_type *peVar4;
  _Atomic_word _Var5;
  int iVar6;
  uint64_t sock_00;
  SingletonLogger *this_01;
  char *pcVar7;
  mapped_type *pmVar8;
  uint err;
  long *in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  SysCallInt64Result SVar11;
  shared_ptr<cppnet::RWSocket> sock;
  shared_ptr<cppnet::AlloterWrap> alloter;
  Address address;
  element_type *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  AlloterWrap *local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  element_type *local_c8;
  element_type *local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  shared_ptr<cppnet::RWSocket> local_b0;
  element_type *local_a0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_98;
  element_type *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  shared_ptr<cppnet::AlloterWrap> local_80;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_70;
  uint64_t local_68;
  Address local_60;
  
  local_70 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)(*in_FS_OFFSET + -0x40);
  do {
    MakePoolAlloterPtr();
    local_d8 = (AlloterWrap *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<cppnet::AlloterWrap,std::allocator<cppnet::AlloterWrap>,std::shared_ptr<cppnet::Alloter>>
              (&local_d0,&local_d8,(allocator<cppnet::AlloterWrap> *)&local_e8,
               (shared_ptr<cppnet::Alloter> *)&local_60);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._ip._M_dataplus._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._ip._M_dataplus._M_p);
    }
    Address::Address(&local_60);
    SVar11 = OsHandle::Accept((this->super_Socket)._sock,&local_60);
    sock_00 = SVar11._return_value;
    if ((long)sock_00 < 0) {
      err = SVar11._errno;
      bVar9 = false;
      if ((err != 0xb) && (err != 0x2733)) {
        this_01 = Singleton<cppnet::SingletonLogger>::Instance();
        pcVar7 = ErrnoInfo(err);
        bVar9 = false;
        SingletonLogger::Error
                  (this_01,
                   "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/socket/connect_socket.cpp"
                   ,0x6a,"accept socket filed! errno:%d, info:%s",(ulong)err,pcVar7);
      }
    }
    else {
      this_00 = (this->super_Socket)._cppnet_base.
                super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0010c59f:
        bVar9 = false;
      }
      else {
        _Var5 = this_00->_M_use_count;
        do {
          if (_Var5 == 0) goto LAB_0010c59f;
          LOCK();
          iVar6 = this_00->_M_use_count;
          bVar9 = _Var5 == iVar6;
          if (bVar9) {
            this_00->_M_use_count = _Var5 + 1;
            iVar6 = _Var5;
          }
          _Var5 = iVar6;
          UNLOCK();
        } while (!bVar9);
        bVar10 = this_00->_M_use_count != 0;
        peVar3 = (this->super_Socket)._cppnet_base.
                 super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        bVar9 = peVar3 != (element_type *)0x0 && bVar10;
        if (peVar3 != (element_type *)0x0 && bVar10) {
          SocketNoblocking(sock_00);
          local_80.super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_d8;
          local_80.super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = local_d0._M_pi;
          if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_d0._M_pi)->_M_use_count = (local_d0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_d0._M_pi)->_M_use_count = (local_d0._M_pi)->_M_use_count + 1;
            }
          }
          local_c8 = peVar3;
          MakeRWSocket((cppnet *)&local_e8,sock_00,&local_80);
          if (local_80.super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_80.super___shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          (*(local_e8->super_Socket)._vptr_Socket[3])
                    (local_e8,(ulong)(this->super_Socket)._addr._port);
          local_90 = local_c8;
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          (local_e8->super_Socket)._cppnet_base.
          super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_c8;
          local_88._M_pi = this_00;
          std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(local_e8->super_Socket)._cppnet_base.
                      super___weak_ptr<cppnet::CppNetBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     &local_88);
          if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
          }
          local_a0 = (this->super_Socket)._event_actions.
                     super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_98._M_pi =
               (this->super_Socket)._event_actions.
               super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_98._M_pi)->_M_weak_count = (local_98._M_pi)->_M_weak_count + 1;
              UNLOCK();
            }
            else {
              (local_98._M_pi)->_M_weak_count = (local_98._M_pi)->_M_weak_count + 1;
            }
          }
          (local_e8->super_Socket)._event_actions.
          super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_a0;
          std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(local_e8->super_Socket)._event_actions.
                      super___weak_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ,&local_98);
          if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = &(local_98._M_pi)->_M_weak_count;
              iVar6 = *p_Var1;
              *p_Var1 = *p_Var1 + -1;
              UNLOCK();
            }
            else {
              iVar6 = (local_98._M_pi)->_M_weak_count;
              (local_98._M_pi)->_M_weak_count = iVar6 + -1;
            }
            if (iVar6 == 1) {
              (*(local_98._M_pi)->_vptr__Sp_counted_base[3])();
            }
          }
          peVar4 = local_e8;
          (local_e8->super_Socket)._addr._address_type = local_60._address_type;
          std::__cxx11::string::_M_assign((string *)&(local_e8->super_Socket)._addr._ip);
          (peVar4->super_Socket)._addr._port = local_60._port;
          local_b8._M_pi =
               (this->super_Socket)._dispatcher.
               super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          if (local_b8._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0010c76f:
            local_c0 = (element_type *)0x0;
          }
          else {
            iVar6 = (local_b8._M_pi)->_M_use_count;
            do {
              if (iVar6 == 0) {
                local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                goto LAB_0010c76f;
              }
              LOCK();
              iVar2 = (local_b8._M_pi)->_M_use_count;
              bVar10 = iVar6 == iVar2;
              if (bVar10) {
                (local_b8._M_pi)->_M_use_count = iVar6 + 1;
                iVar2 = iVar6;
              }
              iVar6 = iVar2;
              UNLOCK();
            } while (!bVar10);
            if ((local_b8._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
               ((local_b8._M_pi)->_M_use_count == 0)) goto LAB_0010c76f;
            local_c0 = (this->super_Socket)._dispatcher.
                       super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          }
          (local_e8->super_Socket)._dispatcher.
          super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_c0;
          std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(local_e8->super_Socket)._dispatcher.
                      super___weak_ptr<cppnet::Dispatcher,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                     &local_b8);
          peVar3 = local_c8;
          if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
          }
          Socket::__all_socket_map::__tls_init();
          local_68 = sock_00;
          pmVar8 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[](local_70,&local_68);
          (pmVar8->super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
               &local_e8->super_Socket;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(pmVar8->super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount,&local_e0);
          local_b0.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_e8;
          local_b0.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = local_e0._M_pi;
          if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_e0._M_pi)->_M_use_count = (local_e0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_e0._M_pi)->_M_use_count = (local_e0._M_pi)->_M_use_count + 1;
            }
          }
          CppNetBase::OnAccept(peVar3,&local_b0);
          if (local_b0.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b0.super___shared_ptr<cppnet::RWSocket,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          (*(local_e8->super_Socket)._vptr_Socket[7])();
          if (local_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0._M_pi);
          }
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    Address::~Address(&local_60);
    if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0._M_pi);
    }
    if (!bVar9) {
      return;
    }
  } while( true );
}

Assistant:

void ConnectSocket::OnAccept() {
    while (true) {
        std::shared_ptr<AlloterWrap> alloter = std::make_shared<AlloterWrap>(MakePoolAlloterPtr());
        Address address;
        //may get more than one connections
        auto ret = OsHandle::Accept(_sock, address);
        if (ret._return_value < 0) {
            if (ret._errno == EAGAIN || ret._errno == WSAEWOULDBLOCK) {
                break;
            }
            LOG_ERROR("accept socket filed! errno:%d, info:%s", ret._errno, ErrnoInfo(ret._errno));
            break;
        }

        auto cppnet_base = _cppnet_base.lock();
        if (!cppnet_base) {
            return;
        }

        //set the socket noblocking
        SocketNoblocking(ret._return_value);
        
        //create a new socket.
        auto sock = MakeRWSocket(ret._return_value, alloter);

        sock->SetListenPort(_addr.GetAddrPort());
        sock->SetCppNetBase(cppnet_base);
        sock->SetEventActions(_event_actions);
        sock->SetAddress(std::move(address));
        sock->SetDispatcher(GetDispatcher());

        __all_socket_map[ret._return_value] = sock;
    
        //call accept call back function
        cppnet_base->OnAccept(sock);

        //start read
        sock->Read();
    }
}